

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetSP.c
# Opt level: O2

void ResizeQueuePages(void)

{
  int iVar1;
  DdNode ***pppDVar2;
  ulong uVar3;
  DdNode ***__ptr;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  iVar1 = queuePage;
  lVar7 = (long)queuePage;
  uVar4 = queuePage + 1;
  queuePage = uVar4;
  if (uVar4 == maxQueuePages) {
    pppDVar2 = (DdNode ***)malloc(lVar7 * 8 + 0x408);
    __ptr = queuePages;
    if (pppDVar2 == (DdNode ***)0x0) {
      for (lVar6 = 0; lVar6 <= lVar7; lVar6 = lVar6 + 1) {
        if (__ptr[lVar6] != (DdNode **)0x0) {
          free(__ptr[lVar6]);
          __ptr[lVar6] = (DdNode **)0x0;
        }
      }
      if (__ptr == (DdNode ***)0x0) {
        memOut = 1;
        return;
      }
      goto LAB_00668d16;
    }
    maxQueuePages = iVar1 + 0x81;
    uVar3 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar3;
    }
    for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      pppDVar2[uVar3] = __ptr[uVar3];
    }
    free(__ptr);
    queuePages = pppDVar2;
  }
  __ptr = queuePages;
  currentQueuePage = (DdNode **)malloc(0x4000);
  __ptr[lVar7 + 1] = currentQueuePage;
  if (currentQueuePage != (DdNode **)0x0) {
    queuePageIndex = 0;
    return;
  }
  currentQueuePage = (DdNode **)0x0;
  for (lVar6 = 0; lVar6 <= lVar7; lVar6 = lVar6 + 1) {
    if (__ptr[lVar6] != (DdNode **)0x0) {
      free(__ptr[lVar6]);
      __ptr[lVar6] = (DdNode **)0x0;
    }
  }
LAB_00668d16:
  free(__ptr);
  queuePages = (DdNode ***)0x0;
  memOut = 1;
  return;
}

Assistant:

static void
ResizeQueuePages(void)
{
    int i;
    DdNode ***newQueuePages;

    queuePage++;
    /* If the current page index is larger than the number of pages
     * allocated, allocate a new page array. Page numbers are incremented by
     * INITIAL_PAGES
     */
    if (queuePage == maxQueuePages) {
        newQueuePages = ABC_ALLOC(DdNode **,maxQueuePages + INITIAL_PAGES);
        if (newQueuePages == NULL) {
            for (i = 0; i < queuePage; i++) ABC_FREE(queuePages[i]);
            ABC_FREE(queuePages);
            memOut = 1;
            return;
        } else {
            for (i = 0; i < maxQueuePages; i++) {
                newQueuePages[i] = queuePages[i];
            }
            /* Increase total page count */
            maxQueuePages += INITIAL_PAGES;
            ABC_FREE(queuePages);
            queuePages = newQueuePages;
        }
    }
    /* Allocate a new page */
    currentQueuePage = queuePages[queuePage] = ABC_ALLOC(DdNode *,queuePageSize);
    if (currentQueuePage == NULL) {
        for (i = 0; i < queuePage; i++) ABC_FREE(queuePages[i]);
        ABC_FREE(queuePages);
        memOut = 1;
        return;
    }
    /* reset page index */
    queuePageIndex = 0;
    return;

}